

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thdat08.c
# Opt level: O0

int th08_open(thdat_t *thdat,thtk_error_t **error)

{
  int iVar1;
  uint size;
  off_t oVar2;
  ssize_t sVar3;
  uchar *data_00;
  thtk_io_t *input;
  thtk_io_t *output;
  char *buf;
  ulong uVar4;
  thdat_entry_t *ptVar5;
  size_t sVar6;
  uint32_t *puVar7;
  thdat_entry_t *entry_1;
  thdat_entry_t *ptStack_80;
  uint i_1;
  thdat_entry_t *prev;
  thdat_entry_t *entry;
  char *pcStack_68;
  uint i;
  uint32_t *ptr;
  thtk_io_t *raw_data;
  thtk_io_t *compressed_data;
  char local_48 [4];
  uint zsize;
  th08_archive_header_t header;
  off_t filesize;
  uchar *zdata;
  uchar *data;
  thtk_error_t **error_local;
  thdat_t *thdat_local;
  
  header._8_8_ = thtk_io_seek(thdat->stream,0,2,error);
  if (header._8_8_ == -1) {
    thdat_local._4_4_ = 0;
  }
  else {
    oVar2 = thtk_io_seek(thdat->stream,0,0,error);
    if (oVar2 == -1) {
      thdat_local._4_4_ = 0;
    }
    else {
      sVar3 = thtk_io_read(thdat->stream,local_48,0x10,error);
      if (sVar3 == -1) {
        thdat_local._4_4_ = 0;
      }
      else {
        iVar1 = strncmp(local_48,"PBGZ",4);
        if (iVar1 == 0) {
          th_decrypt((uchar *)&zsize,0xc,'\x1b','7',0xc,0x400);
          zsize = zsize - 0x1e240;
          header.magic = (char  [4])((int)header.magic - 0x5464e);
          header.count = header.count - 0x8aa53;
          oVar2 = thtk_io_seek(thdat->stream,(ulong)(uint)header.magic,0,error);
          if (oVar2 == -1) {
            thdat_local._4_4_ = 0;
          }
          else {
            size = header.offset - (int)header.magic;
            data_00 = (uchar *)malloc((ulong)size);
            sVar3 = thtk_io_read(thdat->stream,data_00,(ulong)size,error);
            if (sVar3 == -1) {
              thdat_local._4_4_ = 0;
            }
            else {
              th_decrypt(data_00,size,'>',0x9b,0x80,0x400);
              input = thtk_io_open_memory(data_00,(ulong)size,error);
              if (input == (thtk_io_t *)0x0) {
                thdat_local._4_4_ = 0;
              }
              else {
                output = thtk_io_open_growing_memory(error);
                if (output == (thtk_io_t *)0x0) {
                  thdat_local._4_4_ = 0;
                }
                else {
                  sVar3 = th_unlzss(input,output,(ulong)header.count,error);
                  if (sVar3 == -1) {
                    thdat_local._4_4_ = 0;
                  }
                  else {
                    thtk_io_close(input);
                    buf = (char *)malloc((ulong)header.count);
                    oVar2 = thtk_io_seek(output,0,0,error);
                    if (oVar2 == -1) {
                      thdat_local._4_4_ = 0;
                    }
                    else {
                      uVar4 = thtk_io_read(output,buf,(ulong)header.count,error);
                      if (uVar4 == header.count) {
                        thtk_io_close(output);
                        pcStack_68 = buf;
                        for (entry._4_4_ = 0; entry._4_4_ < zsize; entry._4_4_ = entry._4_4_ + 1) {
                          thdat->entry_count = thdat->entry_count + 1;
                          ptVar5 = (thdat_entry_t *)
                                   realloc(thdat->entries,thdat->entry_count * 0x120);
                          thdat->entries = ptVar5;
                          ptVar5 = thdat->entries + (thdat->entry_count - 1);
                          thdat_entry_init(ptVar5);
                          strcpy(ptVar5->name,pcStack_68);
                          sVar6 = strlen(ptVar5->name);
                          ptVar5->offset = (ulong)*(uint *)(pcStack_68 + sVar6 + 1);
                          puVar7 = (uint32_t *)(pcStack_68 + sVar6 + 9);
                          ptVar5->size = (ulong)*(uint *)(pcStack_68 + sVar6 + 5);
                          pcStack_68 = pcStack_68 + sVar6 + 0xd;
                          ptVar5->extra = *puVar7;
                        }
                        if (zsize != 0) {
                          ptStack_80 = (thdat_entry_t *)0x0;
                          for (entry_1._4_4_ = 0; entry_1._4_4_ < zsize;
                              entry_1._4_4_ = entry_1._4_4_ + 1) {
                            ptVar5 = thdat->entries;
                            uVar4 = (ulong)entry_1._4_4_;
                            if (ptStack_80 != (thdat_entry_t *)0x0) {
                              ptStack_80->zsize = ptVar5[uVar4].offset - ptStack_80->offset;
                            }
                            ptStack_80 = ptVar5 + uVar4;
                          }
                          ptStack_80->zsize = (header._8_8_ - (ulong)size) - ptStack_80->offset;
                        }
                        free(buf);
                        thdat_local._4_4_ = 1;
                      }
                      else {
                        thdat_local._4_4_ = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          thtk_error_func_new(error,"th08_open","magic not PBGZ");
          thdat_local._4_4_ = 0;
        }
      }
    }
  }
  return thdat_local._4_4_;
}

Assistant:

static int
th08_open(
    thdat_t* thdat,
    thtk_error_t** error)
{
    unsigned char* data;
    unsigned char* zdata;
    off_t filesize = thtk_io_seek(thdat->stream, 0, SEEK_END, error);
    if (filesize == -1)
        return 0;
    if (thtk_io_seek(thdat->stream, 0, SEEK_SET, error) == -1)
        return 0;

    th08_archive_header_t header;

    if (thtk_io_read(thdat->stream, &header, sizeof(header), error) == -1)
        return 0;

    if (strncmp(header.magic, "PBGZ", 4)) {
        thtk_error_new(error, "magic not PBGZ");
        return 0;
    }

    th_decrypt((unsigned char*)&header + 4, sizeof(header) - 4, 0x1b, 0x37, sizeof(header) - 4, 0x400);

    header.count -= 123456;
    header.offset -= 345678;
    header.size -= 567891;

    if (thtk_io_seek(thdat->stream, header.offset, SEEK_SET, error) == -1)
        return 0;

    unsigned int zsize = filesize - header.offset;
    zdata = malloc(zsize);

    if (thtk_io_read(thdat->stream, zdata, zsize, error) == -1)
        return 0;

    th_decrypt(zdata, zsize, 0x3e, 0x9b, 0x80, 0x400);

    thtk_io_t* compressed_data = thtk_io_open_memory(zdata, zsize, error);
    if (!compressed_data)
        return 0;
    thtk_io_t* raw_data = thtk_io_open_growing_memory(error);
    if (!raw_data)
        return 0;
    if (th_unlzss(compressed_data, raw_data, header.size, error) == -1)
        return 0;

    thtk_io_close(compressed_data);

    data = malloc(header.size);
    if (thtk_io_seek(raw_data, 0, SEEK_SET, error) == -1)
        return 0;
    if (thtk_io_read(raw_data, data, header.size, error) != header.size)
        return 0;
    thtk_io_close(raw_data);

    const uint32_t* ptr = (uint32_t*)data;
    for (unsigned int i = 0; i < header.count; ++i) {
        thdat_entry_t* entry;
        ARRAY_GROW(thdat->entry_count, thdat->entries, entry);
        thdat_entry_init(entry);

        strcpy(entry->name, (char*)ptr);
        ptr = (uint32_t*)((char*)ptr + strlen(entry->name) + 1);
        entry->offset = *ptr++;
        entry->size = *ptr++;
        entry->extra = *ptr++;
    }

    if (header.count) {
        thdat_entry_t* prev = NULL;
        for (unsigned int i = 0; i < header.count; ++i) {
            thdat_entry_t* entry = &thdat->entries[i];
            if (prev)
                prev->zsize = entry->offset - prev->offset;
            prev = entry;
        }
        prev->zsize = (filesize - zsize) - prev->offset;
    }

    free(data);

    return 1;
}